

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShortcutsWindow.cpp
# Opt level: O2

void __thiscall
cursespp::ShortcutsWindow::AddShortcut
          (ShortcutsWindow *this,string *key,string *description,int64_t attrs)

{
  Entry *this_00;
  shared_ptr<cursespp::ShortcutsWindow::Entry> sStack_38;
  
  this_00 = (Entry *)operator_new(0x50);
  Entry::Entry(this_00,key,description,attrs);
  std::__shared_ptr<cursespp::ShortcutsWindow::Entry,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<cursespp::ShortcutsWindow::Entry,void>
            ((__shared_ptr<cursespp::ShortcutsWindow::Entry,(__gnu_cxx::_Lock_policy)2> *)&sStack_38
             ,this_00);
  std::
  vector<std::shared_ptr<cursespp::ShortcutsWindow::Entry>,std::allocator<std::shared_ptr<cursespp::ShortcutsWindow::Entry>>>
  ::emplace_back<std::shared_ptr<cursespp::ShortcutsWindow::Entry>>
            ((vector<std::shared_ptr<cursespp::ShortcutsWindow::Entry>,std::allocator<std::shared_ptr<cursespp::ShortcutsWindow::Entry>>>
              *)&this->entries,&sStack_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sStack_38.
              super___shared_ptr<cursespp::ShortcutsWindow::Entry,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  (*(this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[5])(this);
  return;
}

Assistant:

void ShortcutsWindow::AddShortcut(
    const std::string& key,
    const std::string& description,
    int64_t attrs)
{
    this->entries.push_back(
        std::shared_ptr<Entry>(new Entry(key, description, attrs)));

    this->Redraw();
}